

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O3

uint64_t color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  color_quad_u8 *pcVar4;
  undefined1 auVar5 [13];
  uint uVar6;
  int iVar7;
  uint64_t uVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar23;
  float fVar24;
  uint uVar25;
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  vec4F xl;
  vec4F xl_00;
  vec4F xl_01;
  vec4F xl_02;
  vec4F xl_03;
  vec4F xl_04;
  vec4F xh;
  vec4F xh_00;
  vec4F xh_01;
  vec4F xh_02;
  vec4F xh_03;
  vec4F xh_04;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  vec4F local_b8;
  vec4F local_a8;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  uint32_t local_48 [2];
  uint8_t *puStack_40;
  uint8_t *local_38;
  undefined1 auVar26 [16];
  
  pResults->m_best_overall_err = 0xffffffffffffffff;
  if (mode == 1) {
    pcVar4 = pParams->m_pPixels;
    uVar9 = (ulong)pParams->m_num_pixels;
    if (1 < uVar9) {
      lVar15 = 0;
      do {
        if (((pcVar4->m_c[0] != pcVar4[lVar15 + 1].m_c[0]) ||
            (pcVar4->m_c[1] != pcVar4[lVar15 + 1].m_c[1])) ||
           (pcVar4->m_c[2] != pcVar4[lVar15 + 1].m_c[2])) goto LAB_00106587;
        lVar15 = lVar15 + 1;
      } while (uVar9 - 1 != lVar15);
    }
    uVar8 = pack_mode1_to_one_color
                      (pParams,pResults,(uint)pcVar4->m_c[0],(uint)pcVar4->m_c[1],
                       (uint)pcVar4->m_c[2],pResults->m_pSelectors);
    return uVar8;
  }
  uVar12 = pParams->m_num_pixels;
  uVar9 = (ulong)uVar12;
  if (mode == 7) {
    pcVar4 = pParams->m_pPixels;
    if (1 < uVar12) {
      lVar15 = 0;
      do {
        if (((pcVar4->m_c[0] != pcVar4[lVar15 + 1].m_c[0]) ||
            (pcVar4->m_c[1] != pcVar4[lVar15 + 1].m_c[1])) ||
           ((pcVar4->m_c[2] != pcVar4[lVar15 + 1].m_c[2] ||
            (pcVar4->m_c[3] != pcVar4[lVar15 + 1].m_c[3])))) goto LAB_00106587;
        lVar15 = lVar15 + 1;
      } while (uVar9 - 1 != lVar15);
    }
    uVar8 = pack_mode7_to_one_color
                      (pParams,pResults,(uint)pcVar4->m_c[0],(uint)pcVar4->m_c[1],
                       (uint)pcVar4->m_c[2],(uint)pcVar4->m_c[3],pResults->m_pSelectors,uVar12,
                       pcVar4);
    return uVar8;
  }
LAB_00106587:
  iVar7 = (int)uVar9;
  if (iVar7 == 0) {
    fVar17 = 0.0;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar23 = 0.0;
  }
  else {
    uVar14 = 0;
    fVar19 = 0.0;
    fVar23 = 0.0;
    fVar17 = 0.0;
    fVar18 = 0.0;
    do {
      uVar2 = *(ushort *)pParams->m_pPixels[uVar14].m_c;
      fVar17 = fVar17 + (float)(uVar2 & 0xff);
      fVar18 = fVar18 + (float)(byte)(uVar2 >> 8);
      uVar2 = *(ushort *)(pParams->m_pPixels[uVar14].m_c + 2);
      fVar19 = fVar19 + (float)(uVar2 & 0xff);
      fVar23 = fVar23 + (float)(byte)(uVar2 >> 8);
      uVar14 = uVar14 + 1;
    } while (uVar9 != uVar14);
  }
  fVar30 = 1.0 / ((float)uVar9 * 255.0);
  fVar28 = fVar17 * fVar30;
  fVar31 = fVar18 * fVar30;
  local_c0 = 0.0;
  local_c4 = 0.0;
  if ((0.0 <= fVar28) && (local_c4 = fVar28, 1.0 < fVar28)) {
    local_c4 = 1.0;
  }
  fVar28 = fVar19 * fVar30;
  if ((0.0 <= fVar31) && (local_c0 = fVar31, 1.0 < fVar31)) {
    local_c0 = 1.0;
  }
  fVar31 = 1.0 / (float)uVar9;
  fVar30 = fVar23 * fVar30;
  local_bc = 0.0;
  local_c8 = 0.0;
  if ((0.0 <= fVar28) && (local_c8 = fVar28, 1.0 < fVar28)) {
    local_c8 = 1.0;
  }
  if ((0.0 <= fVar30) && (local_bc = fVar30, 1.0 < fVar30)) {
    local_bc = 1.0;
  }
  fVar17 = fVar17 * fVar31;
  fVar18 = fVar18 * fVar31;
  fVar19 = fVar19 * fVar31;
  if (pParams->m_has_alpha == '\0') {
    if (iVar7 == 0) {
      fVar30 = 0.0;
      fVar20 = 0.0;
      fVar33 = 0.0;
      fVar28 = 0.0;
      fVar24 = 0.0;
      fVar32 = 0.0;
    }
    else {
      fVar28 = 0.0;
      uVar14 = 0;
      fVar33 = 0.0;
      fVar30 = 0.0;
      fVar20 = 0.0;
      fVar24 = 0.0;
      fVar32 = 0.0;
      do {
        fVar34 = (float)pParams->m_pPixels[uVar14].m_c[0] - fVar17;
        uVar2 = *(ushort *)(pParams->m_pPixels[uVar14].m_c + 1);
        fVar35 = (float)(uVar2 & 0xff) - fVar18;
        fVar40 = (float)(byte)(uVar2 >> 8) - fVar19;
        fVar28 = fVar28 + fVar34 * fVar34;
        fVar24 = fVar24 + fVar34 * fVar35;
        fVar32 = fVar32 + fVar34 * fVar40;
        fVar33 = fVar33 + fVar35 * fVar35;
        fVar30 = fVar30 + fVar40 * fVar35;
        fVar20 = fVar20 + fVar40 * fVar40;
        uVar14 = uVar14 + 1;
      } while (uVar9 != uVar14);
    }
    fVar35 = 1.0;
    fVar40 = 0.7;
    iVar13 = 3;
    fVar34 = 0.9;
    do {
      fVar36 = fVar40 * fVar32 + fVar34 * fVar28 + fVar24 * fVar35;
      fVar37 = fVar40 * fVar30 + fVar34 * fVar24 + fVar35 * fVar33;
      fVar40 = fVar40 * fVar20 + fVar34 * fVar32 + fVar35 * fVar30;
      fVar34 = ABS(fVar36);
      if (ABS(fVar36) <= ABS(fVar37)) {
        fVar34 = ABS(fVar37);
      }
      if (fVar34 <= ABS(fVar40)) {
        fVar34 = ABS(fVar40);
      }
      fVar38 = 1.0 / fVar34;
      if (1e-10 < fVar34) {
        fVar36 = fVar36 * fVar38;
      }
      uVar12 = (int)((uint)(1e-10 < fVar34) << 0x1f) >> 0x1f;
      uVar25 = (int)((uint)(1e-10 < fVar34) << 0x1f) >> 0x1f;
      fVar35 = (float)(~uVar12 & (uint)fVar37 | (uint)(fVar38 * fVar37) & uVar12);
      fVar40 = (float)(~uVar25 & (uint)fVar40 | (uint)(fVar38 * fVar40) & uVar25);
      iVar13 = iVar13 + -1;
      fVar34 = fVar36;
    } while (iVar13 != 0);
    fVar32 = fVar40 * fVar40 + fVar36 * fVar36 + fVar35 * fVar35;
    fVar20 = 0.0;
    fVar24 = 0.0;
    fVar28 = 0.0;
    fVar30 = 0.0;
    if (1e-10 <= fVar32) {
      fVar28 = 1.0 / SQRT(fVar32);
      fVar20 = fVar36 * fVar28;
      fVar24 = fVar35 * fVar28;
      fVar28 = fVar40 * fVar28;
      fVar30 = 0.0;
    }
  }
  else {
    if (iVar7 == 0) {
      fVar20 = 0.0;
      fVar24 = 0.0;
      fVar28 = 0.0;
      fVar30 = 0.0;
    }
    else {
      uVar14 = 0;
      fVar20 = 0.0;
      fVar24 = 0.0;
      fVar28 = 0.0;
      fVar30 = 0.0;
      do {
        uVar12 = *(uint *)pParams->m_pPixels[uVar14].m_c;
        auVar5[0xc] = (char)(uVar12 >> 0x18);
        auVar5._0_12_ = ZEXT712(0);
        fVar36 = (float)(uVar12 & 0xff) - fVar17;
        fVar37 = (float)(uVar12 >> 8 & 0xff) - fVar18;
        fVar38 = (float)(int)CONCAT32(auVar5._10_3_,(ushort)(byte)(uVar12 >> 0x10)) - fVar19;
        fVar39 = (float)(uint3)(auVar5._10_3_ >> 0x10) - fVar23 * fVar31;
        fVar32 = fVar36;
        fVar33 = fVar37;
        fVar34 = fVar38;
        fVar35 = fVar39;
        fVar40 = fVar37 * fVar37;
        if (uVar14 != 0) {
          fVar32 = fVar20;
          fVar33 = fVar24;
          fVar34 = fVar28;
          fVar35 = fVar30;
          fVar40 = fVar24 * fVar24;
        }
        fVar40 = fVar35 * fVar35 + fVar34 * fVar34 + fVar32 * fVar32 + fVar40;
        if ((fVar40 != 0.0) || (NAN(fVar40))) {
          fVar40 = 1.0 / SQRT(fVar40);
          fVar32 = fVar32 * fVar40;
          fVar33 = fVar33 * fVar40;
          fVar34 = fVar34 * fVar40;
          fVar35 = fVar35 * fVar40;
        }
        fVar20 = fVar20 + fVar35 * fVar39 * fVar36 +
                          fVar34 * fVar36 * fVar38 +
                          fVar32 * fVar36 * fVar36 + fVar33 * fVar36 * fVar37;
        fVar24 = fVar24 + fVar35 * fVar39 * fVar37 +
                          fVar34 * fVar38 * fVar37 +
                          fVar32 * fVar36 * fVar37 + fVar33 * fVar37 * fVar37;
        fVar28 = fVar28 + fVar35 * fVar39 * fVar38 +
                          fVar34 * fVar38 * fVar38 +
                          fVar32 * fVar36 * fVar38 + fVar33 * fVar38 * fVar37;
        fVar30 = fVar30 + fVar35 * fVar39 * fVar39 +
                          fVar34 * fVar39 * fVar38 +
                          fVar32 * fVar39 * fVar36 + fVar33 * fVar39 * fVar37;
        uVar14 = uVar14 + 1;
      } while (uVar9 != uVar14);
    }
    fVar32 = fVar30 * fVar30 + fVar28 * fVar28 + fVar20 * fVar20 + fVar24 * fVar24;
    if ((fVar32 != 0.0) || (NAN(fVar32))) {
      fVar32 = 1.0 / SQRT(fVar32);
      fVar20 = fVar20 * fVar32;
      fVar24 = fVar24 * fVar32;
      fVar28 = fVar28 * fVar32;
      fVar30 = fVar30 * fVar32;
    }
  }
  if (fVar30 * fVar30 + fVar28 * fVar28 + fVar20 * fVar20 + fVar24 * fVar24 < 0.5) {
    bVar16 = pParams->m_perceptual == '\0';
    uVar12 = (uint)bVar16 * 4;
    uVar25 = (uint)bVar16;
    uVar21 = (int)(uVar25 << 0x1f) >> 0x1f;
    uVar25 = (int)(uVar25 << 0x1f) >> 0x1f;
    fVar20 = (float)(uVar21 & 0x3f800000 | ~uVar21 & 0x3e5a1cac);
    fVar24 = (float)(uVar25 & 0x3f800000 | ~uVar25 & 0x3f370a3d);
    fVar28 = *(float *)(&DAT_001211a0 + uVar12);
    fVar30 = 0.0;
    if (pParams->m_has_alpha != '\0') {
      fVar30 = fVar24;
    }
    fVar32 = fVar30 * fVar30 +
             fVar28 * fVar28 + fVar20 * fVar20 + *(float *)(&DAT_001211a8 + uVar12);
    if ((fVar32 != 0.0) || (NAN(fVar32))) {
      fVar32 = 1.0 / SQRT(fVar32);
      fVar20 = fVar20 * fVar32;
      fVar24 = fVar24 * fVar32;
      fVar28 = fVar28 * fVar32;
      fVar30 = fVar30 * fVar32;
    }
  }
  if (iVar7 == 0) {
    fVar32 = 3921568.8;
    fVar33 = -3921568.8;
  }
  else {
    pcVar4 = pParams->m_pPixels;
    fVar33 = -1e+09;
    fVar32 = 1e+09;
    uVar14 = 0;
    do {
      fVar34 = ((float)pcVar4[uVar14].m_c[3] - fVar23 * fVar31) * fVar30 +
               ((float)pcVar4[uVar14].m_c[2] - fVar19) * fVar28 +
               ((float)pcVar4[uVar14].m_c[0] - fVar17) * fVar20 +
               ((float)pcVar4[uVar14].m_c[1] - fVar18) * fVar24;
      if (fVar34 <= fVar32) {
        fVar32 = fVar34;
      }
      if (fVar33 <= fVar34) {
        fVar33 = fVar34;
      }
      uVar14 = uVar14 + 1;
    } while (uVar9 != uVar14);
    fVar32 = fVar32 * 0.003921569;
    fVar33 = fVar33 * 0.003921569;
  }
  fVar23 = fVar20 * fVar32 + local_c4;
  fVar19 = fVar24 * fVar32 + local_c0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  if ((0.0 <= fVar23) && (fVar17 = fVar23, fVar18 = fVar24, 1.0 < fVar23)) {
    fVar17 = 1.0;
    fVar18 = 0.0;
  }
  fVar34 = fVar28 * fVar32 + local_c8;
  fVar23 = 0.0;
  fVar31 = 0.0;
  if ((0.0 <= fVar19) && (fVar23 = fVar19, fVar31 = fVar24, 1.0 < fVar19)) {
    fVar23 = 1.0;
    fVar31 = 0.0;
  }
  fVar35 = fVar32 * fVar30 + local_bc;
  fVar19 = 0.0;
  fVar32 = 0.0;
  if ((0.0 <= fVar34) && (fVar19 = fVar34, fVar32 = fVar30, 1.0 < fVar34)) {
    fVar19 = 1.0;
    fVar32 = 0.0;
  }
  fVar34 = fVar20 * fVar33 + local_c4;
  fVar20 = 0.0;
  if ((0.0 <= fVar35) && (fVar20 = fVar35, 1.0 < fVar35)) {
    fVar20 = 1.0;
  }
  fVar36 = fVar24 * fVar33 + local_c0;
  fVar35 = 0.0;
  fVar40 = 0.0;
  if ((0.0 <= fVar34) && (fVar35 = fVar34, fVar40 = fVar24, 1.0 < fVar34)) {
    fVar35 = 1.0;
    fVar40 = 0.0;
  }
  fVar37 = fVar28 * fVar33 + local_c8;
  fVar28 = 0.0;
  fVar34 = 0.0;
  if ((0.0 <= fVar36) && (fVar28 = fVar36, fVar34 = fVar24, 1.0 < fVar36)) {
    fVar28 = 1.0;
    fVar34 = 0.0;
  }
  fVar36 = fVar30 * fVar33 + local_bc;
  fVar24 = 0.0;
  fVar33 = 0.0;
  if ((0.0 <= fVar37) && (fVar24 = fVar37, fVar33 = fVar30, 1.0 < fVar37)) {
    fVar24 = 1.0;
    fVar33 = 0.0;
  }
  fVar37 = 0.0;
  fVar38 = 0.0;
  if ((0.0 <= fVar36) && (fVar37 = fVar36, fVar38 = fVar30, 1.0 < fVar36)) {
    fVar37 = 1.0;
    fVar38 = 0.0;
  }
  auVar27._4_4_ = fVar18;
  auVar27._0_4_ = fVar17;
  auVar27._8_4_ = fVar18;
  auVar27._12_4_ = fVar31;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._4_4_ = fVar23;
  auVar26._0_4_ = fVar17;
  auVar29._0_8_ = CONCAT44(fVar20,fVar19);
  auVar29._8_4_ = fVar32;
  auVar29._12_4_ = 0;
  if (fVar20 + fVar19 + fVar23 + fVar17 <= fVar37 + fVar24 + fVar28 + fVar35) {
    auVar22._8_4_ = fVar32;
    auVar22._0_8_ = auVar29._0_8_;
    auVar22._12_4_ = 0;
    auVar29._4_4_ = fVar37;
    auVar29._0_4_ = fVar24;
    auVar29._8_4_ = fVar33;
    auVar29._12_4_ = fVar38;
    auVar26._4_4_ = fVar28;
    auVar26._0_4_ = fVar35;
    auVar26._8_4_ = fVar40;
    auVar26._12_4_ = fVar34;
  }
  else {
    auVar22._4_4_ = fVar37;
    auVar22._0_4_ = fVar24;
    auVar22._8_4_ = fVar33;
    auVar22._12_4_ = fVar38;
    fVar17 = fVar35;
    fVar23 = fVar28;
  }
  xl.m_c[1] = fVar23;
  xl.m_c[0] = fVar17;
  xl.m_c._8_8_ = auVar22._0_8_;
  xh.m_c._0_8_ = auVar26._0_8_;
  xh.m_c._8_8_ = auVar29._0_8_;
  uVar8 = find_optimal_solution(mode,xl,xh,pParams,pResults);
  if (uVar8 != 0) {
    if (pComp_params->m_try_least_squares != '\0') {
      selectors_temp[0] = '\0';
      selectors_temp[1] = '\0';
      selectors_temp[2] = '\0';
      selectors_temp[3] = '\0';
      selectors_temp[4] = '\0';
      selectors_temp[5] = '\0';
      selectors_temp[6] = '\0';
      selectors_temp[7] = '\0';
      selectors_temp[8] = '\0';
      selectors_temp[9] = '\0';
      selectors_temp[10] = '\0';
      selectors_temp[0xb] = '\0';
      selectors_temp[0xc] = '\0';
      selectors_temp[0xd] = '\0';
      selectors_temp[0xe] = '\0';
      selectors_temp[0xf] = '\0';
      selectors_temp1[0] = '\0';
      selectors_temp1[1] = '\0';
      selectors_temp1[2] = '\0';
      selectors_temp1[3] = '\0';
      selectors_temp1[4] = '\0';
      selectors_temp1[5] = '\0';
      selectors_temp1[6] = '\0';
      selectors_temp1[7] = '\0';
      selectors_temp1[8] = '\0';
      selectors_temp1[9] = '\0';
      selectors_temp1[10] = '\0';
      selectors_temp1[0xb] = '\0';
      selectors_temp1[0xc] = '\0';
      selectors_temp1[0xd] = '\0';
      selectors_temp1[0xe] = '\0';
      selectors_temp1[0xf] = '\0';
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (vec4F *)selectors_temp,(vec4F *)selectors_temp1,pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (vec4F *)selectors_temp,(vec4F *)selectors_temp1,pParams->m_pPixels);
      }
      xl_00.m_c[0] = (float)selectors_temp._0_8_ * 0.003921569;
      xl_00.m_c[1] = SUB84(selectors_temp._0_8_,4) * 0.003921569;
      xl_00.m_c[2] = (float)selectors_temp._8_8_ * 0.003921569;
      xl_00.m_c[3] = SUB84(selectors_temp._8_8_,4) * 0.003921569;
      xh_00.m_c[0] = (float)selectors_temp1._0_8_ * 0.003921569;
      xh_00.m_c[1] = SUB84(selectors_temp1._0_8_,4) * 0.003921569;
      xh_00.m_c[2] = (float)selectors_temp1._8_8_ * 0.003921569;
      xh_00.m_c[3] = SUB84(selectors_temp1._8_8_,4) * 0.003921569;
      uVar8 = find_optimal_solution(mode,xl_00,xh_00,pParams,pResults);
      if (uVar8 == 0) {
        return 0;
      }
    }
    if (pComp_params->m_uber_level == 0) {
LAB_0010716c:
      if (mode == 1) {
        local_38 = pResults->m_pSelectors_temp;
        selectors_temp._0_8_ = pResults->m_best_overall_err;
        selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
        selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
        selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
        selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
        selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
        selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
        selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
        selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
        local_48 = *&pResults->m_pbits;
        puStack_40 = pResults->m_pSelectors;
        uVar9 = pack_mode1_to_one_color
                          (pParams,(color_cell_compressor_results *)selectors_temp,
                           (int)(local_c4 * 255.0 + 0.5),(int)(local_c0 * 255.0 + 0.5),
                           (int)(local_c8 * 255.0 + 0.5),pResults->m_pSelectors_temp);
      }
      else {
        if (mode != 7) {
          return pResults->m_best_overall_err;
        }
        local_38 = pResults->m_pSelectors_temp;
        selectors_temp._0_8_ = pResults->m_best_overall_err;
        selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
        selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
        selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
        selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
        selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
        selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
        selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
        selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
        local_48 = *&pResults->m_pbits;
        puStack_40 = pResults->m_pSelectors;
        uVar9 = pack_mode7_to_one_color
                          (pParams,(color_cell_compressor_results *)selectors_temp,
                           (int)(local_c4 * 255.0 + 0.5),(int)(local_c0 * 255.0 + 0.5),
                           (int)(local_c8 * 255.0 + 0.5),(int)(local_bc * 255.0 + 0.5),
                           pResults->m_pSelectors_temp,pParams->m_num_pixels,pParams->m_pPixels);
      }
      if (uVar9 < pResults->m_best_overall_err) {
        *&pResults->m_pbits = local_48;
        pResults->m_pSelectors = puStack_40;
        pResults->m_pSelectors_temp = local_38;
        pResults->m_best_overall_err = selectors_temp._0_8_;
        (pResults->m_low_endpoint).m_c[0] = selectors_temp[8];
        (pResults->m_low_endpoint).m_c[1] = selectors_temp[9];
        (pResults->m_low_endpoint).m_c[2] = selectors_temp[10];
        (pResults->m_low_endpoint).m_c[3] = selectors_temp[0xb];
        (pResults->m_high_endpoint).m_c[0] = selectors_temp[0xc];
        (pResults->m_high_endpoint).m_c[1] = selectors_temp[0xd];
        (pResults->m_high_endpoint).m_c[2] = selectors_temp[0xe];
        (pResults->m_high_endpoint).m_c[3] = selectors_temp[0xf];
        memcpy(pResults->m_pSelectors,local_38,(ulong)pParams->m_num_pixels);
        pResults->m_best_overall_err = uVar9;
        return uVar9;
      }
      return pResults->m_best_overall_err;
    }
    uVar12 = pParams->m_num_pixels;
    uVar9 = (ulong)uVar12;
    memcpy(selectors_temp,pResults->m_pSelectors,uVar9);
    uVar3 = pParams->m_num_selector_weights;
    uVar25 = uVar3 - 1;
    if (uVar9 == 0) {
      uVar11 = 0;
      uVar21 = 0x10;
    }
    else {
      uVar14 = 0;
      uVar21 = 0x10;
      uVar11 = 0;
      do {
        bVar1 = selectors_temp[uVar14];
        if (bVar1 <= uVar21) {
          uVar21 = (uint)bVar1;
        }
        uVar6 = (uint)bVar1;
        if (bVar1 < uVar11) {
          uVar6 = uVar11;
        }
        uVar11 = uVar6;
        uVar14 = uVar14 + 1;
      } while (uVar9 != uVar14);
      if (uVar9 != 0) {
        uVar14 = 0;
        do {
          bVar1 = selectors_temp[uVar14];
          selectors_temp1[uVar14] =
               bVar1 + ((bVar1 <= uVar25 && uVar25 != bVar1) && uVar21 == bVar1);
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
    }
    local_a8.m_c[0] = 0.0;
    local_a8.m_c[1] = 0.0;
    local_a8.m_c[2] = 0.0;
    local_a8.m_c[3] = 0.0;
    local_b8.m_c = (float  [4])ZEXT816(0);
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar12,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,&local_b8,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar12,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,&local_b8,
                 pParams->m_pPixels);
    }
    xl_01.m_c[0] = local_a8.m_c[0] * 0.003921569;
    xl_01.m_c[1] = local_a8.m_c[1] * 0.003921569;
    fVar17 = local_a8.m_c[3];
    local_a8.m_c[2] = local_a8.m_c[2] * 0.003921569;
    local_a8.m_c[3] = fVar17 * 0.003921569;
    local_a8.m_c[1] = xl_01.m_c[1];
    local_a8.m_c[0] = xl_01.m_c[0];
    xh_01.m_c[0] = local_b8.m_c[0] * 0.003921569;
    xh_01.m_c[1] = local_b8.m_c[1] * 0.003921569;
    xh_01.m_c[2] = local_b8.m_c[2] * 0.003921569;
    xh_01.m_c[3] = local_b8.m_c[3] * 0.003921569;
    local_b8.m_c[2] = xh_01.m_c[2];
    local_b8.m_c[0] = xh_01.m_c[0];
    local_b8.m_c[1] = xh_01.m_c[1];
    local_b8.m_c[3] = xh_01.m_c[3];
    xl_01.m_c[2] = local_a8.m_c[2];
    xl_01.m_c[3] = local_a8.m_c[3];
    uVar8 = find_optimal_solution(mode,xl_01,xh_01,pParams,pResults);
    if (uVar8 != 0) {
      uVar12 = pParams->m_num_pixels;
      if ((ulong)uVar12 != 0) {
        uVar9 = 0;
        do {
          bVar1 = selectors_temp[uVar9];
          selectors_temp1[uVar9] = bVar1 - (uVar11 == bVar1 && bVar1 != 0);
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
      }
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (uVar12,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,&local_b8,
                   pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (uVar12,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,&local_b8,
                   pParams->m_pPixels);
      }
      xl_02.m_c[0] = local_a8.m_c[0] * 0.003921569;
      xl_02.m_c[1] = local_a8.m_c[1] * 0.003921569;
      fVar17 = local_a8.m_c[3];
      local_a8.m_c[2] = local_a8.m_c[2] * 0.003921569;
      local_a8.m_c[3] = fVar17 * 0.003921569;
      local_a8.m_c[1] = xl_02.m_c[1];
      local_a8.m_c[0] = xl_02.m_c[0];
      xh_02.m_c[0] = local_b8.m_c[0] * 0.003921569;
      xh_02.m_c[1] = local_b8.m_c[1] * 0.003921569;
      xh_02.m_c[2] = local_b8.m_c[2] * 0.003921569;
      xh_02.m_c[3] = local_b8.m_c[3] * 0.003921569;
      local_b8.m_c[2] = xh_02.m_c[2];
      local_b8.m_c[0] = xh_02.m_c[0];
      local_b8.m_c[1] = xh_02.m_c[1];
      local_b8.m_c[3] = xh_02.m_c[3];
      xl_02.m_c[2] = local_a8.m_c[2];
      xl_02.m_c[3] = local_a8.m_c[3];
      uVar8 = find_optimal_solution(mode,xl_02,xh_02,pParams,pResults);
      if (uVar8 != 0) {
        uVar12 = pParams->m_num_pixels;
        if ((ulong)uVar12 != 0) {
          uVar9 = 0;
          do {
            bVar1 = selectors_temp[uVar9];
            if ((uVar21 != bVar1) ||
               (cVar10 = '\x01', pParams->m_num_selector_weights - 1 <= uVar21)) {
              cVar10 = -(bVar1 != 0 && uVar11 == bVar1);
            }
            selectors_temp1[uVar9] = bVar1 + cVar10;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
        if (pParams->m_has_alpha == '\0') {
          compute_least_squares_endpoints_rgb
                    (uVar12,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,&local_b8,
                     pParams->m_pPixels);
        }
        else {
          compute_least_squares_endpoints_rgba
                    (uVar12,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,&local_b8,
                     pParams->m_pPixels);
        }
        xl_03.m_c[0] = local_a8.m_c[0] * 0.003921569;
        xl_03.m_c[1] = local_a8.m_c[1] * 0.003921569;
        xl_03.m_c[2] = local_a8.m_c[2] * 0.003921569;
        xl_03.m_c[3] = local_a8.m_c[3] * 0.003921569;
        xh_03.m_c[0] = local_b8.m_c[0] * 0.003921569;
        xh_03.m_c[1] = local_b8.m_c[1] * 0.003921569;
        xh_03.m_c[2] = local_b8.m_c[2] * 0.003921569;
        xh_03.m_c[3] = local_b8.m_c[3] * 0.003921569;
        uVar8 = find_optimal_solution(mode,xl_03,xh_03,pParams,pResults);
        if (uVar8 != 0) {
          uVar12 = pComp_params->m_uber_level;
          if ((1 < uVar12) &&
             ((ulong)(pParams->m_num_pixels * 0x38 >> 4) < pResults->m_best_overall_err)) {
            iVar7 = 1;
            if (3 < uVar12) {
              iVar7 = uVar12 - 2;
            }
            if (-2 < iVar7) {
              iVar13 = -iVar7;
              fVar17 = (float)(int)uVar25;
              uVar21 = 3;
              if (3 < uVar12) {
                uVar21 = uVar12;
              }
              do {
                if ((int)(uVar3 - 2) <= (int)(iVar7 + uVar25)) {
                  uVar12 = uVar3 - 2;
                  do {
                    if (uVar12 != uVar25 || iVar13 != 0) {
                      uVar11 = pParams->m_num_pixels;
                      if ((ulong)uVar11 != 0) {
                        uVar9 = 0;
                        do {
                          fVar19 = floorf((((float)selectors_temp[uVar9] - (float)iVar13) * fVar17)
                                          / ((float)(int)uVar12 - (float)iVar13) + 0.5);
                          fVar18 = 0.0;
                          if ((0.0 <= fVar19) && (fVar18 = fVar19, fVar17 < fVar19)) {
                            fVar18 = fVar17;
                          }
                          selectors_temp1[uVar9] = (uint8_t)(int)fVar18;
                          uVar9 = uVar9 + 1;
                        } while (uVar11 != uVar9);
                      }
                      local_a8.m_c[0] = 0.0;
                      local_a8.m_c[1] = 0.0;
                      local_a8.m_c[2] = 0.0;
                      local_a8.m_c[3] = 0.0;
                      local_b8.m_c = (float  [4])ZEXT816(0);
                      if (pParams->m_has_alpha == '\0') {
                        compute_least_squares_endpoints_rgb
                                  (uVar11,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,
                                   &local_b8,pParams->m_pPixels);
                      }
                      else {
                        compute_least_squares_endpoints_rgba
                                  (uVar11,selectors_temp1,pParams->m_pSelector_weightsx,&local_a8,
                                   &local_b8,pParams->m_pPixels);
                      }
                      xl_04.m_c[0] = local_a8.m_c[0] * 0.003921569;
                      xl_04.m_c[1] = local_a8.m_c[1] * 0.003921569;
                      fVar18 = local_a8.m_c[3];
                      local_a8.m_c[2] = local_a8.m_c[2] * 0.003921569;
                      local_a8.m_c[3] = fVar18 * 0.003921569;
                      local_a8.m_c[1] = xl_04.m_c[1];
                      local_a8.m_c[0] = xl_04.m_c[0];
                      xh_04.m_c[0] = local_b8.m_c[0] * 0.003921569;
                      xh_04.m_c[1] = local_b8.m_c[1] * 0.003921569;
                      xh_04.m_c[2] = local_b8.m_c[2] * 0.003921569;
                      xh_04.m_c[3] = local_b8.m_c[3] * 0.003921569;
                      local_b8.m_c[2] = xh_04.m_c[2];
                      local_b8.m_c[0] = xh_04.m_c[0];
                      local_b8.m_c[1] = xh_04.m_c[1];
                      local_b8.m_c[3] = xh_04.m_c[3];
                      xl_04.m_c[2] = local_a8.m_c[2];
                      xl_04.m_c[3] = local_a8.m_c[3];
                      uVar8 = find_optimal_solution(mode,xl_04,xh_04,pParams,pResults);
                      if (uVar8 == 0) {
                        return 0;
                      }
                    }
                    bVar16 = uVar12 != (uVar21 + uVar3) - 3;
                    uVar12 = uVar12 + 1;
                  } while (bVar16);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 != 2);
            }
          }
          goto LAB_0010716c;
        }
      }
    }
  }
  return 0;
}

Assistant:

static uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	assert((mode == 6) || (mode == 7) || (!pParams->m_has_alpha));

	pResults->m_best_overall_err = UINT64_MAX;

	// If the partition's colors are all the same in mode 1, then just pack them as a single color.
	if (mode == 1)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
	}
	else if (mode == 7)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2], ca = pParams->m_pPixels[0].m_c[3];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]) || (ca != pParams->m_pPixels[i].m_c[3]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode7_to_one_color(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors, pParams->m_num_pixels, pParams->m_pPixels);
	}

	// Compute partition's mean color and principle axis.
	vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);

	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			vec4F a = vec4F_mul(&color, color.m_c[0]);
			vec4F b = vec4F_mul(&color, color.m_c[1]);
			vec4F c = vec4F_mul(&color, color.m_c[2]);
			vec4F d = vec4F_mul(&color, color.m_c[3]);
			vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float vfr = .9f, vfg = 1.0f, vfb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = vfr*cov[0] + vfg*cov[1] + vfb*cov[2];
			float g = vfr*cov[1] + vfg*cov[3] + vfb*cov[4];
			float b = vfr*cov[2] + vfg*cov[4] + vfb*cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m;	b *= m;
			}

			vfr = r; vfg = g; vfb = b;
		}

		float len = vfr*vfr + vfg*vfg + vfb*vfb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			vfr *= len; vfg *= len; vfb *= len;
			vec4F_set(&axis, vfr, vfg, vfb, 0);
		}
	}

	// TODO: Try picking the 2 colors with the largest projection onto the axis, instead of computing new colors along the axis.
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	vec4F b0 = vec4F_mul(&axis, l);
	vec4F b1 = vec4F_mul(&axis, h);
	vec4F c0 = vec4F_add(&meanColor, &b0);
	vec4F c1 = vec4F_add(&meanColor, &b1);
	vec4F minColor = vec4F_saturate(&c0);
	vec4F maxColor = vec4F_saturate(&c1);
				
	vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);

	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 0
		// Don't compile correctly with VC 2019 in release.
		vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#else
		float a = minColor.m_c[0], b = minColor.m_c[1], c = minColor.m_c[2], d = minColor.m_c[3];
		minColor.m_c[0] = maxColor.m_c[0];
		minColor.m_c[1] = maxColor.m_c[1];
		minColor.m_c[2] = maxColor.m_c[2];
		minColor.m_c[3] = maxColor.m_c[3];
		maxColor.m_c[0] = a;
		maxColor.m_c[1] = b;
		maxColor.m_c[2] = c;
		maxColor.m_c[3] = d;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	if (pComp_params->m_try_least_squares)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if (pComp_params->m_uber_level > 0)
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 16;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}

	if (mode == 1)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
		uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
	else if (mode == 7)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
		uint64_t avg_err = pack_mode7_to_one_color(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp, pParams->m_num_pixels, pParams->m_pPixels);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
				
	return pResults->m_best_overall_err;
}